

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int google::protobuf::internal::CalculateReserveSize<bool,8>(int capacity,int new_size)

{
  int *piVar1;
  int local_24 [2];
  int doubled_size;
  int kSooCapacityElements;
  int kMaxSizeBeforeClamp;
  int lower_limit;
  int new_size_local;
  int capacity_local;
  
  kSooCapacityElements = 8;
  if (new_size < 8) {
    new_size_local = 8;
  }
  else {
    doubled_size = 0x3ffffffb;
    kMaxSizeBeforeClamp = new_size;
    lower_limit = capacity;
    if (capacity < 0x3ffffffc) {
      local_24[1] = 3;
      if (capacity < 8) {
        lower_limit = 0;
      }
      local_24[0] = lower_limit * 2 + 8;
      piVar1 = std::max<int>(local_24,&kMaxSizeBeforeClamp);
      new_size_local = *piVar1;
    }
    else {
      new_size_local = std::numeric_limits<int>::max();
    }
  }
  return new_size_local;
}

Assistant:

inline int CalculateReserveSize(int capacity, int new_size) {
  constexpr int lower_limit =
      RepeatedFieldLowerClampLimit<T, kHeapRepHeaderSize>();
  if (new_size < lower_limit) {
    // Clamp to smallest allowed size.
    return lower_limit;
  }
  constexpr int kMaxSizeBeforeClamp =
      (std::numeric_limits<int>::max() - kHeapRepHeaderSize) / 2;
  if (ABSL_PREDICT_FALSE(capacity > kMaxSizeBeforeClamp)) {
    return std::numeric_limits<int>::max();
  }
  constexpr int kSooCapacityElements = SooCapacityElements(sizeof(T));
  if (kSooCapacityElements > 0 && kSooCapacityElements < lower_limit) {
    // In this case, we need to set capacity to 0 here to ensure power-of-two
    // sized allocations.
    if (capacity < lower_limit) capacity = 0;
  } else {
    ABSL_DCHECK(capacity == 0 || capacity >= lower_limit)
        << capacity << " " << lower_limit;
  }
  // We want to double the number of bytes, not the number of elements, to try
  // to stay within power-of-two allocations.
  // The allocation has kHeapRepHeaderSize + sizeof(T) * capacity.
  int doubled_size = 2 * capacity + kHeapRepHeaderSize / sizeof(T);
  return std::max(doubled_size, new_size);
}